

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void __thiscall
cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(SaveRestoreEnvironment *this)

{
  long lVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  currentEnv;
  string var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  char *local_68 [4];
  string local_48 [32];
  
  this->_vptr_SaveRestoreEnvironment = (_func_int **)&PTR__SaveRestoreEnvironment_001f3b90;
  GetEnvironmentVariables_abi_cxx11_();
  for (pbVar2 = local_80.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_80.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string((string *)local_68,(string *)pbVar2);
    lVar1 = std::__cxx11::string::find((char *)local_68,0x1bb86a);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)local_68);
      std::__cxx11::string::operator=((string *)local_68,local_48);
      std::__cxx11::string::~string(local_48);
    }
    unsetenv(local_68[0]);
    std::__cxx11::string::~string((string *)local_68);
  }
  AppendEnv(&this->Env);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Env);
  return;
}

Assistant:

cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment()
{
  // First clear everything in the current environment:
  std::vector<std::string> currentEnv = GetEnvironmentVariables();
  for(std::vector<std::string>::const_iterator
        eit = currentEnv.begin(); eit != currentEnv.end(); ++eit)
    {
    std::string var(*eit);

    std::string::size_type pos = var.find("=");
    if (pos != std::string::npos)
      {
      var = var.substr(0, pos);
      }

    cmSystemTools::UnsetEnv(var.c_str());
    }

  // Then put back each entry from the original environment:
  cmSystemTools::AppendEnv(this->Env);
}